

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

uint64_t __thiscall fmp4_stream::media_fragment::get_duration(media_fragment *this)

{
  reference pvVar1;
  uint local_20;
  uint local_1c;
  uint32_t sample_duration;
  uint i;
  uint64_t duration;
  media_fragment *this_local;
  
  _sample_duration = (ulong)(this->trex_).default_sample_duration_;
  for (local_1c = 0; local_1c < *(uint *)&(this->trun_).super_full_box.field_0x6c;
      local_1c = local_1c + 1) {
    local_20 = (this->tfhd_).default_sample_duration_;
    if (((this->trun_).sample_duration_present_ & 1U) == 0) {
      if (((this->tfhd_).super_full_box.field_0x6e & 1) != 0) {
        local_20 = (this->tfhd_).default_sample_duration_;
      }
    }
    else {
      pvVar1 = std::
               vector<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
               ::operator[](&(this->trun_).m_sentry,(ulong)local_1c);
      local_20 = pvVar1->sample_duration_;
    }
    _sample_duration = local_20 + _sample_duration;
  }
  return _sample_duration;
}

Assistant:

uint64_t media_fragment::get_duration()
	{
		uint64_t duration = this->trex_.default_sample_duration_;

		for (unsigned int i = 0; i < trun_.sample_count_; i++)
		{
			uint32_t sample_duration = tfhd_.default_sample_duration_;
			if (trun_.sample_duration_present_)
			{
				sample_duration = trun_.m_sentry[i].sample_duration_;
			}
			else if (tfhd_.default_sample_duration_present_)
				sample_duration = tfhd_.default_sample_duration_;
			
			duration += sample_duration;
		}
		return duration;
	}